

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

Pipeline * __thiscall
capnp::Request<capnp::AnyPointer,_capnp::AnyPointer>::sendForPipeline
          (Pipeline *__return_storage_ptr__,Request<capnp::AnyPointer,_capnp::AnyPointer> *this)

{
  RequestHook *pRVar1;
  Disposer *pDVar2;
  Disposer *local_38;
  PipelineHook *pPStack_30;
  PipelineOp *local_28;
  size_t local_20;
  ArrayDisposer *local_18;
  
  (*((this->hook).ptr)->_vptr_RequestHook[2])(&local_38);
  pRVar1 = (this->hook).ptr;
  if (pRVar1 != (RequestHook *)0x0) {
    (this->hook).ptr = (RequestHook *)0x0;
    pDVar2 = (this->hook).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pRVar1->_vptr_RequestHook + (long)pRVar1->_vptr_RequestHook[-2]));
  }
  (__return_storage_ptr__->hook).disposer = local_38;
  (__return_storage_ptr__->hook).ptr = pPStack_30;
  (__return_storage_ptr__->ops).ptr = local_28;
  (__return_storage_ptr__->ops).size_ = local_20;
  (__return_storage_ptr__->ops).disposer = local_18;
  return __return_storage_ptr__;
}

Assistant:

typename Results::Pipeline Request<Params, Results>::sendForPipeline() {
  auto typelessPipeline = hook->sendForPipeline();
  hook = nullptr;  // prevent reuse
  return typename Results::Pipeline(kj::mv(typelessPipeline));
}